

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O2

void __thiscall
LASreadItemCompressed_POINT10_v2::~LASreadItemCompressed_POINT10_v2
          (LASreadItemCompressed_POINT10_v2 *this)

{
  IntegerCompressor *pIVar1;
  ArithmeticModel *pAVar2;
  long lVar3;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015f930;
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_changed_values);
  pIVar1 = this->ic_intensity;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_scan_angle_rank[0]);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_scan_angle_rank[1]);
  pIVar1 = this->ic_point_source_ID;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  for (lVar3 = -0x800; lVar3 != 0; lVar3 = lVar3 + 8) {
    pAVar2 = *(ArithmeticModel **)((long)this->m_classification + lVar3);
    if (pAVar2 != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec,pAVar2);
    }
    pAVar2 = *(ArithmeticModel **)((long)this->m_user_data + lVar3);
    if (pAVar2 != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec,pAVar2);
    }
    pAVar2 = *(ArithmeticModel **)((long)&this->ic_dx + lVar3);
    if (pAVar2 != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec,pAVar2);
    }
  }
  pIVar1 = this->ic_dx;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_dy;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_z;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  return;
}

Assistant:

LASreadItemCompressed_POINT10_v2::~LASreadItemCompressed_POINT10_v2()
{
  U32 i;

  dec->destroySymbolModel(m_changed_values);
  delete ic_intensity;
  dec->destroySymbolModel(m_scan_angle_rank[0]);
  dec->destroySymbolModel(m_scan_angle_rank[1]);
  delete ic_point_source_ID;
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) dec->destroySymbolModel(m_bit_byte[i]);
    if (m_classification[i]) dec->destroySymbolModel(m_classification[i]);
    if (m_user_data[i]) dec->destroySymbolModel(m_user_data[i]);
  }
  delete ic_dx;
  delete ic_dy;
  delete ic_z;
}